

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O1

uvec4 ImageCodec::decodeUINT_UINTPacked<unsigned_char>(ImageCodec *codec,void *ptr)

{
  pointer pSVar1;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 aVar2;
  uint32_t *puVar3;
  long lVar4;
  long lVar5;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  pSVar1 = (codec->packedSampleInfo).
           super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(codec->packedSampleInfo).
                super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 2) * -0x5555555555555555;
    puVar3 = &pSVar1->bitLength;
    lVar5 = 0;
    do {
      if (lVar5 == 4) {
        __assert_fail("i >= 0 && i < this->length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/other_include/glm/gtc/../gtc/../detail/../detail/type_vec4.inl"
                      ,0x14a,
                      "T &glm::vec<4, unsigned int>::operator[](typename vec<4, T, P>::length_type) [L = 4, T = unsigned int, P = glm::packed_highp]"
                     );
      }
      *(uint *)((long)&local_18 + (ulong)((uint)lVar5 & 3) * 4) =
           ~(-1 << ((byte)*puVar3 & 0x1f)) &
           (uint)(*(byte *)((long)ptr + (ulong)((SampleInfo *)(puVar3 + -2))->elementIndex) >>
                 ((byte)puVar3[-1] & 0x1f));
      lVar5 = lVar5 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  aVar2._8_8_ = uStack_10;
  aVar2._0_8_ = local_18;
  return (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)aVar2.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            result[static_cast<glm::length_t>(i)] = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
        }
        return result;
    }